

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSamplerTests.cpp
# Opt level: O2

vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> * __thiscall
vkt::pipeline::anon_unknown_0::SamplerAddressModesTest::createVertices
          (vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
           *__return_storage_ptr__,SamplerAddressModesTest *this)

{
  pointer pVVar1;
  Vec4 *pVVar2;
  size_t vertexNdx_1;
  size_t vertexNdx;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  Vector<float,_3> local_80;
  undefined1 local_70 [16];
  int local_60;
  Vector<float,_3> local_58;
  Vector<float,_2> local_48;
  Vector<float,_2> local_3c;
  
  SamplerTest::createVertices(__return_storage_ptr__,&this->super_SamplerTest);
  switch((this->super_SamplerTest).m_imageViewType) {
  case VK_IMAGE_VIEW_TYPE_1D:
  case VK_IMAGE_VIEW_TYPE_1D_ARRAY:
    pVVar1 = (__return_storage_ptr__->
             super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar4 = (long)(__return_storage_ptr__->
                  super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1 >> 5;
    pVVar2 = &pVVar1->texCoord;
    while (bVar5 = lVar4 != 0, lVar4 = lVar4 + -1, bVar5) {
      pVVar2->m_data[0] = (pVVar2->m_data[0] + -0.5) * 4.0;
      pVVar2 = pVVar2 + 2;
    }
    break;
  case VK_IMAGE_VIEW_TYPE_2D:
  case VK_IMAGE_VIEW_TYPE_2D_ARRAY:
    lVar4 = 0x10;
    for (uVar3 = 0;
        pVVar1 = (__return_storage_ptr__->
                 super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                 )._M_impl.super__Vector_impl_data._M_start,
        uVar3 < (ulong)((long)(__return_storage_ptr__->
                              super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1 >> 5);
        uVar3 = uVar3 + 1) {
      local_80.m_data._0_8_ = *(undefined8 *)((long)(pVVar1->position).m_data + lVar4);
      local_58.m_data[0] = 0.5;
      local_58.m_data[1] = 0.5;
      tcu::operator-((Vector<float,_2> *)&local_80,(Vector<float,_2> *)&local_58);
      tcu::operator*(4.0,&local_48);
      local_70._0_8_ =
           (long)(((__return_storage_ptr__->
                   super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                   )._M_impl.super__Vector_impl_data._M_start)->position).m_data + lVar4;
      local_70._8_4_ = 0;
      local_70._12_4_ = 1;
      tcu::VecAccess<float,_4,_2>::operator=((VecAccess<float,_4,_2> *)local_70,&local_3c);
      lVar4 = lVar4 + 0x20;
    }
    break;
  case VK_IMAGE_VIEW_TYPE_3D:
    lVar4 = 0x10;
    for (uVar3 = 0;
        pVVar1 = (__return_storage_ptr__->
                 super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                 )._M_impl.super__Vector_impl_data._M_start,
        uVar3 < (ulong)((long)(__return_storage_ptr__->
                              super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1 >> 5);
        uVar3 = uVar3 + 1) {
      local_80.m_data[2] = *(float *)((long)(pVVar1->position).m_data + lVar4 + 8);
      local_80.m_data._0_8_ = *(undefined8 *)((long)(pVVar1->position).m_data + lVar4);
      tcu::Vector<float,_3>::Vector(&local_58,0.5);
      tcu::operator-((tcu *)&local_48,&local_80,&local_58);
      tcu::operator*((tcu *)&local_3c,4.0,(Vector<float,_3> *)&local_48);
      local_70._0_8_ =
           (long)(((__return_storage_ptr__->
                   super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                   )._M_impl.super__Vector_impl_data._M_start)->position).m_data + lVar4;
      local_70._8_4_ = 0;
      local_70._12_4_ = 1;
      local_60 = 2;
      tcu::VecAccess<float,_4,_3>::operator=
                ((VecAccess<float,_4,_3> *)local_70,(Vector<float,_3> *)&local_3c);
      lVar4 = lVar4 + 0x20;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vertex4Tex4> SamplerAddressModesTest::createVertices (void) const
{
	std::vector<Vertex4Tex4> vertices = SamplerTest::createVertices();

	switch (m_imageViewType)
	{
		case VK_IMAGE_VIEW_TYPE_1D: case VK_IMAGE_VIEW_TYPE_1D_ARRAY:
			for (size_t vertexNdx = 0; vertexNdx < vertices.size(); vertexNdx++)
				vertices[vertexNdx].texCoord.x() = (vertices[vertexNdx].texCoord.x() - 0.5f) * 4.0f;

			break;

		case VK_IMAGE_VIEW_TYPE_2D:
		case VK_IMAGE_VIEW_TYPE_2D_ARRAY:
			for (size_t vertexNdx = 0; vertexNdx < vertices.size(); vertexNdx++)
				vertices[vertexNdx].texCoord.xy() = (vertices[vertexNdx].texCoord.swizzle(0, 1) - tcu::Vec2(0.5f)) * 4.0f;

			break;

		case VK_IMAGE_VIEW_TYPE_3D:
			for (size_t vertexNdx = 0; vertexNdx < vertices.size(); vertexNdx++)
				vertices[vertexNdx].texCoord.xyz() = (vertices[vertexNdx].texCoord.swizzle(0, 1, 2) - tcu::Vec3(0.5f)) * 4.0f;

			break;

		case VK_IMAGE_VIEW_TYPE_CUBE:
		case VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
			break;

		default:
			DE_ASSERT(false);
	}

	return vertices;
}